

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>
                *this)

{
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar1;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  if (((*(int *)(**(long **)&((((pFVar1->fadexpr_).left_)->fadexpr_).expr_)->fadexpr_ + 0x28) != 0)
      && ((((pFVar1->fadexpr_).right_)->dx_).num_elts != 0)) &&
     ((((this->left_->fadexpr_).right_)->dx_).num_elts != 0)) {
    return (this->right_->dx_).num_elts != 0;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}